

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::inverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int i;
  long lVar7;
  int j;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined8 uStack_34;
  float fStack_2c;
  undefined8 local_28;
  float fStack_20;
  undefined8 uStack_1c;
  undefined8 uStack_14;
  float local_c;
  
  puVar5 = &local_48;
  puVar6 = &local_48;
  fVar10 = this->x[0][3];
  if (((((fVar10 != 0.0) || (NAN(fVar10))) || (fVar10 = this->x[1][3], fVar10 != 0.0)) ||
      ((NAN(fVar10) || (fVar10 = this->x[2][3], fVar10 != 0.0)))) ||
     ((NAN(fVar10) || ((fVar10 = this->x[3][3], fVar10 != 1.0 || (NAN(fVar10))))))) {
    gjInverse(__return_storage_ptr__,this);
  }
  else {
    fVar10 = this->x[1][1];
    fVar9 = this->x[1][2];
    fVar11 = this->x[0][2];
    fVar12 = this->x[0][0];
    fVar1 = this->x[0][1];
    fVar2 = this->x[2][0];
    fVar3 = this->x[1][0];
    uVar4 = *(undefined8 *)(this->x[2] + 1);
    fVar13 = (float)uVar4;
    fVar14 = (float)((ulong)uVar4 >> 0x20);
    fVar15 = fVar10 * fVar14 - fVar9 * fVar13;
    local_38 = fVar2 * fVar9 - fVar14 * fVar3;
    local_48 = CONCAT44(fVar11 * fVar13 - fVar14 * fVar1,fVar15);
    fStack_40 = fVar1 * fVar9 - fVar11 * fVar10;
    fStack_3c = 0.0;
    uStack_34 = CONCAT44(fVar11 * fVar3 - fVar9 * fVar12,fVar14 * fVar12 - fVar11 * fVar2);
    fStack_2c = 0.0;
    fVar9 = fVar3 * fVar13 - fVar10 * fVar2;
    local_28 = CONCAT44(fVar2 * fVar1 - fVar13 * fVar12,fVar9);
    fStack_20 = fVar12 * fVar10 - fVar1 * fVar3;
    uStack_1c = 0;
    uStack_14 = 0;
    local_c = 1.0;
    fVar9 = fVar9 * fVar11 + fVar15 * fVar12 + local_38 * fVar1;
    fVar10 = fVar9;
    if (fVar9 <= -fVar9) {
      fVar10 = -fVar9;
    }
    if (1.0 <= fVar10) {
      lVar7 = 0;
      do {
        lVar8 = 0;
        do {
          *(float *)((long)puVar6 + lVar8 * 4) = *(float *)((long)puVar6 + lVar8 * 4) / fVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar7 = lVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0x10);
      } while (lVar7 != 3);
    }
    else {
      lVar7 = 0;
      do {
        lVar8 = 0;
        do {
          fVar11 = *(float *)((long)puVar5 + lVar8 * 4);
          fVar12 = fVar11;
          if (fVar11 <= -fVar11) {
            fVar12 = -fVar11;
          }
          if (fVar10 * 8.507059e+37 <= fVar12) {
            __return_storage_ptr__->x[0][0] = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
            *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
            __return_storage_ptr__->x[1][1] = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
            __return_storage_ptr__->x[2][2] = 1.0;
            *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
            __return_storage_ptr__->x[3][3] = 1.0;
            return __return_storage_ptr__;
          }
          *(float *)((long)puVar5 + lVar8 * 4) = fVar11 / fVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar7 = lVar7 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0x10);
      } while (lVar7 != 3);
    }
    fVar11 = (float)((uint)this->x[3][0] ^ (uint)DAT_001c32e0);
    fVar10 = this->x[3][1];
    fVar9 = this->x[3][2];
    __return_storage_ptr__->x[0][0] = (float)local_48;
    __return_storage_ptr__->x[0][1] = local_48._4_4_;
    __return_storage_ptr__->x[0][2] = fStack_40;
    __return_storage_ptr__->x[0][3] = fStack_3c;
    __return_storage_ptr__->x[1][0] = local_38;
    __return_storage_ptr__->x[1][1] = (float)uStack_34;
    __return_storage_ptr__->x[1][2] = uStack_34._4_4_;
    __return_storage_ptr__->x[1][3] = fStack_2c;
    __return_storage_ptr__->x[2][0] = (float)local_28;
    __return_storage_ptr__->x[2][1] = local_28._4_4_;
    __return_storage_ptr__->x[2][2] = fStack_20;
    __return_storage_ptr__->x[2][3] = (float)uStack_1c;
    *(ulong *)__return_storage_ptr__->x[3] =
         CONCAT44((fVar11 * local_48._4_4_ - fVar10 * (float)uStack_34) - fVar9 * local_28._4_4_,
                  (fVar11 * (float)local_48 - fVar10 * local_38) - fVar9 * (float)local_28);
    __return_storage_ptr__->x[3][2] =
         (fStack_40 * fVar11 - uStack_34._4_4_ * fVar10) - fStack_20 * fVar9;
    __return_storage_ptr__->x[3][3] = local_c;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>
                 Matrix44<T>::inverse () const IMATH_NOEXCEPT
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse ();

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}